

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

void Sim_UtilSimulate(Sim_Man_t *p,int fType)

{
  Abc_Obj_t *pNode;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = p->pNtk->vObjs;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar1->pArray[lVar2];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Sim_UtilSimulateNode(p,pNode,fType,fType,fType);
      }
      lVar2 = lVar2 + 1;
      pVVar1 = p->pNtk->vObjs;
    } while (lVar2 < pVVar1->nSize);
  }
  pVVar1 = p->pNtk->vCos;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      Sim_UtilSimulateNode(p,(Abc_Obj_t *)pVVar1->pArray[lVar2],fType,fType,fType);
      lVar2 = lVar2 + 1;
      pVVar1 = p->pNtk->vCos;
    } while (lVar2 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Sim_UtilSimulate( Sim_Man_t * p, int fType )
{
    Abc_Obj_t * pNode;
    int i;
    // simulate the internal nodes
    Abc_NtkForEachNode( p->pNtk, pNode, i )
        Sim_UtilSimulateNode( p, pNode, fType, fType, fType );
    // assign simulation info of the CO nodes
    Abc_NtkForEachCo( p->pNtk, pNode, i )
        Sim_UtilSimulateNode( p, pNode, fType, fType, fType );
}